

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O3

string * __thiscall
cpptrace::microfmt::format<char_const*const&,int_const&,char_const*&,char_const*&>
          (string *__return_storage_ptr__,microfmt *this,char *fmt,char **args,int *args_1,
          char **args_2,char **args_3)

{
  size_t sVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  array<cpptrace::microfmt::detail::format_value,_4UL> in_stack_ffffffffffffff08;
  undefined8 local_90 [2];
  undefined4 local_80;
  long local_78;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_50;
  char *local_48;
  undefined4 local_38;
  
  bVar5 = 0;
  sVar1 = strlen((char *)this);
  local_90[0] = *(undefined8 *)fmt;
  local_80 = 5;
  local_78 = (long)*(int *)args;
  local_68 = 1;
  local_60 = *(undefined8 *)args_1;
  local_50 = 5;
  local_48 = *args_2;
  local_38 = 5;
  puVar3 = local_90;
  puVar4 = (undefined8 *)&stack0xffffffffffffff08;
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  detail::format<4ul,char_const*>
            (__return_storage_ptr__,(detail *)this,(char *)(this + sVar1),(char *)0x0,
             in_stack_ffffffffffffff08);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, Args&&... args) {
        return detail::format<sizeof...(args)>(fmt, fmt + std::strlen(fmt), {detail::format_value(args)...});
    }